

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StructureAnalyzer.cpp
# Opt level: O0

vector<dg::vr::BorderValue,_std::allocator<dg::vr::BorderValue>_> * __thiscall
dg::vr::StructureAnalyzer::getBorderValuesFor(StructureAnalyzer *this,Function *func)

{
  pointer ppVar1;
  map<const_llvm::Function_*,_std::vector<dg::vr::BorderValue,_std::allocator<dg::vr::BorderValue>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_std::vector<dg::vr::BorderValue,_std::allocator<dg::vr::BorderValue>_>_>_>_>
  *in_stack_ffffffffffffffe8;
  
  std::
  map<const_llvm::Function_*,_std::vector<dg::vr::BorderValue,_std::allocator<dg::vr::BorderValue>_>,_std::less<const_llvm::Function_*>,_std::allocator<std::pair<const_llvm::Function_*const,_std::vector<dg::vr::BorderValue,_std::allocator<dg::vr::BorderValue>_>_>_>_>
  ::find(in_stack_ffffffffffffffe8,(key_type *)0x1f1564);
  ppVar1 = std::
           _Rb_tree_const_iterator<std::pair<const_llvm::Function_*const,_std::vector<dg::vr::BorderValue,_std::allocator<dg::vr::BorderValue>_>_>_>
           ::operator->((_Rb_tree_const_iterator<std::pair<const_llvm::Function_*const,_std::vector<dg::vr::BorderValue,_std::allocator<dg::vr::BorderValue>_>_>_>
                         *)0x1f1570);
  return &ppVar1->second;
}

Assistant:

const std::vector<BorderValue> &
StructureAnalyzer::getBorderValuesFor(const llvm::Function *func) const {
    assert(hasBorderValues(func));
    return borderValues.find(func)->second;
}